

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_reader.hpp
# Opt level: O2

void __thiscall
duckdb::ColumnReader::
PlainSkipTemplatedDefines<duckdb::TemplatedParquetValueConversion<unsigned_long>,true>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values)

{
  if (plain_data->len < num_values * 8) {
    PlainSkipTemplatedInternal<duckdb::TemplatedParquetValueConversion<unsigned_long>,true,true>
              (this,plain_data,defines,num_values,0);
    return;
  }
  PlainSkipTemplatedInternal<duckdb::TemplatedParquetValueConversion<unsigned_long>,true,false>
            (this,plain_data,defines,num_values,0);
  return;
}

Assistant:

static bool PlainAvailable(const ByteBuffer &plain_data, const idx_t count) {
		return plain_data.check_available(count * sizeof(VALUE_TYPE));
	}